

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_condest.c
# Opt level: O0

double lu_normest(lu_int m,lu_int *Ubegin,lu_int *Ui,double *Ux,double *pivot,lu_int *perm,int upper
                 ,double *work)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_78;
  int local_74;
  double temp;
  double y1norm;
  double xinfnorm;
  double x1norm;
  lu_int p;
  lu_int kinc;
  lu_int kend;
  lu_int kbeg;
  lu_int k;
  lu_int j;
  lu_int i;
  lu_int *perm_local;
  double *pivot_local;
  double *Ux_local;
  lu_int *Ui_local;
  lu_int *Ubegin_local;
  lu_int m_local;
  
  x1norm = 0.0;
  xinfnorm = 0.0;
  if (upper == 0) {
    kbeg = m + -1;
    kend = -1;
    kinc = -1;
  }
  else {
    kbeg = 0;
    kinc = 1;
    kend = m;
  }
  for (k = kbeg; k != kend; k = kinc + k) {
    if (perm == (lu_int *)0x0) {
      local_74 = k;
    }
    else {
      local_74 = perm[k];
    }
    temp = 0.0;
    for (p = Ubegin[local_74]; -1 < Ui[p]; p = p + 1) {
      temp = -work[Ui[p]] * Ux[p] + temp;
    }
    iVar1 = -1;
    if (0.0 <= temp) {
      iVar1 = 1;
    }
    temp = (double)iVar1 + temp;
    if (pivot != (double *)0x0) {
      temp = temp / pivot[local_74];
    }
    work[local_74] = temp;
    x1norm = ABS(temp) + x1norm;
    dVar3 = ABS(temp);
    dVar2 = dVar3;
    if (dVar3 <= xinfnorm) {
      dVar2 = xinfnorm;
    }
    xinfnorm = (double)(~-(ulong)NAN(xinfnorm) & (ulong)dVar2 | -(ulong)NAN(xinfnorm) & (ulong)dVar3
                       );
  }
  y1norm = 0.0;
  if (upper == 0) {
    kbeg = 0;
    kinc = 1;
    kend = m;
  }
  else {
    kbeg = m + -1;
    kend = -1;
    kinc = -1;
  }
  for (k = kbeg; k != kend; k = kinc + k) {
    if (perm == (lu_int *)0x0) {
      local_78 = k;
    }
    else {
      local_78 = perm[k];
    }
    if (pivot != (double *)0x0) {
      work[local_78] = work[local_78] / pivot[local_78];
    }
    dVar2 = work[local_78];
    for (p = Ubegin[local_78]; iVar1 = Ui[p], -1 < iVar1; p = p + 1) {
      work[iVar1] = -dVar2 * Ux[p] + work[iVar1];
    }
    y1norm = ABS(dVar2) + y1norm;
  }
  dVar3 = y1norm / x1norm;
  dVar2 = xinfnorm;
  if (xinfnorm <= dVar3) {
    dVar2 = dVar3;
  }
  return (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 | -(ulong)NAN(dVar3) & (ulong)xinfnorm);
}

Assistant:

double lu_normest(
    lu_int m, const lu_int *Ubegin, const lu_int *Ui, const double *Ux,
    const double *pivot, const lu_int *perm, int upper, double *work)
{
    lu_int i, j, k, kbeg, kend, kinc, p;
    double x1norm, xinfnorm, y1norm, temp;

    x1norm = 0;
    xinfnorm = 0;
    if (upper)
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    else
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        temp = 0;
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            temp -= work[i] * Ux[p];
        temp += temp >= 0 ? 1 : -1; /* choose b[i] = 1 or b[i] = -1 */
        if (pivot) temp /= pivot[j];
        work[j] = temp;
        x1norm += fabs(temp);
        xinfnorm = fmax(xinfnorm, fabs(temp));
    }

    y1norm = 0;
    if (upper)
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    else
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        if (pivot) work[j] /= pivot[j];
        temp = work[j];
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            work[i] -= temp * Ux[p];
        y1norm += fabs(temp);
    }

    return fmax(y1norm/x1norm, xinfnorm);
}